

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsNodeQueue.cpp
# Opt level: O3

int __thiscall HighsNodeQueue::unlink(HighsNodeQueue *this,char *__name)

{
  int extraout_EAX;
  char *local_38;
  CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree> local_30;
  HighsNodeQueue *local_20;
  
  local_38 = __name;
  local_20 = this;
  if ((this->nodes).
      super__Vector_base<HighsNodeQueue::OpenNode,_std::allocator<HighsNodeQueue::OpenNode>_>.
      _M_impl.super__Vector_impl_data._M_start[(long)__name].estimate < INFINITY) {
    local_30.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->hybridEstimRoot;
    local_30.first_ = &this->hybridEstimMin;
    ::highs::CacheMinRbTree<HighsNodeQueue::NodeHybridEstimRbTree>::unlink(&local_30,__name);
    local_30.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->lowerRoot;
    local_30.first_ = &this->lowerMin;
    local_20 = this;
    ::highs::CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree>::unlink
              ((CacheMinRbTree<HighsNodeQueue::NodeLowerRbTree> *)&local_30,__name);
  }
  else {
    local_30.super_RbTree<HighsNodeQueue::NodeHybridEstimRbTree>.rootNode = &this->suboptimalRoot;
    local_30.first_ = &this->suboptimalMin;
    ::highs::CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree>::unlink
              ((CacheMinRbTree<HighsNodeQueue::SuboptimalNodeRbTree> *)&local_30,__name);
    this->numSuboptimal = this->numSuboptimal + -1;
  }
  unlink_domchgs(this,(int64_t)__name);
  std::priority_queue<long,_std::vector<long,_std::allocator<long>_>,_std::greater<long>_>::push
            (&this->freeslots,(value_type *)&local_38);
  return extraout_EAX;
}

Assistant:

void HighsNodeQueue::unlink(int64_t node) {
  if (nodes[node].estimate == kHighsInf) {
    unlink_suboptimal(node);
  } else {
    unlink_estim(node);
    unlink_lower(node);
  }
  unlink_domchgs(node);
  freeslots.push(node);
}